

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnImportTag
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index tag_index,Index sig_index)

{
  ModuleDesc *pMVar1;
  Result RVar2;
  Enum EVar3;
  pointer *__ptr;
  Location loc;
  TagType tag_type;
  undefined1 local_158 [16];
  pointer local_148;
  pointer local_140;
  Type *local_138;
  long local_130;
  Type local_128 [2];
  long *local_118;
  long local_110;
  long local_108 [2];
  Location local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  _func_int **local_b8;
  undefined1 local_a8 [8];
  char *pcStack_a0;
  anon_union_16_2_ecfd7102_for_Location_1 local_98;
  pointer local_88;
  Var local_78;
  
  local_140 = (pointer)field_name._M_str;
  local_148 = (pointer)module_name._M_str;
  local_f8.field_1.field_0.last_column = 0;
  local_f8.filename._M_len = (this->filename_)._M_len;
  local_f8.filename._M_str = (this->filename_)._M_str;
  local_f8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_0.last_column = 0;
  local_a8 = (undefined1  [8])(this->filename_)._M_len;
  pcStack_a0 = (this->filename_)._M_str;
  local_98.field_1.offset = local_f8.field_1.field_1.offset;
  Var::Var(&local_78,sig_index,(Location *)local_a8);
  RVar2 = SharedValidator::OnTag(&this->validator_,&local_f8,&local_78);
  Var::~Var(&local_78);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    pcStack_a0 = (char *)0x4;
    local_158._8_8_ = &PTR__TagType_00244310;
    local_a8 = (undefined1  [8])&PTR__TagType_00244310;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_98.field_0,
               &(this->module_->func_types).
                super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
                _M_impl.super__Vector_impl_data._M_start[sig_index].params);
    pMVar1 = this->module_;
    local_118 = local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,local_148,(char *)((long)&local_148->enum_ + module_name._M_len)
              );
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,local_140,(char *)((long)&local_140->enum_ + field_name._M_len))
    ;
    TagType::Clone((TagType *)local_158);
    local_f8.filename._M_len = (size_t)&local_f8.field_1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_118,local_110 + (long)local_118);
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,local_138,(long)&local_138->enum_ + local_130);
    local_b8 = (_func_int **)local_158._0_8_;
    local_158._0_8_ = (_func_int **)0x0;
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&local_f8);
    if (local_b8 != (_func_int **)0x0) {
      (**(code **)(*local_b8 + 8))();
    }
    local_b8 = (_func_int **)0x0;
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0],local_c8[0] + 1);
    }
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_f8.filename._M_len != &local_f8.field_1) {
      operator_delete((void *)local_f8.filename._M_len,(long)local_f8.field_1.field_1.offset + 1);
    }
    if ((_func_int **)local_158._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_158._0_8_ + 8))();
    }
    local_158._0_8_ = (_func_int **)0x0;
    if (local_138 != local_128) {
      operator_delete(local_138,(long)local_128[0] + 1);
    }
    if (local_118 != local_108) {
      operator_delete(local_118,local_108[0] + 1);
    }
    std::vector<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>::push_back
              (&this->tag_types_,(value_type *)local_a8);
    local_a8 = (undefined1  [8])local_158._8_8_;
    if (local_98.field_1.offset != 0) {
      operator_delete((void *)local_98.field_1.offset,(long)local_88 - local_98._0_8_);
    }
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnImportTag(Index import_index,
                                       std::string_view module_name,
                                       std::string_view field_name,
                                       Index tag_index,
                                       Index sig_index) {
  CHECK_RESULT(validator_.OnTag(GetLocation(), Var(sig_index, GetLocation())));
  FuncType& func_type = module_.func_types[sig_index];
  TagType tag_type{TagAttr::Exception, func_type.params};
  module_.imports.push_back(ImportDesc{ImportType(
      std::string(module_name), std::string(field_name), tag_type.Clone())});
  tag_types_.push_back(tag_type);
  return Result::Ok;
}